

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

void submit_work(thread_pool *thread_pool,work_item *first,work_item *last)

{
  mtx_t *pmVar1;
  work_item *pwVar2;
  work_queue *pwVar3;
  work_item *pwVar4;
  
  pwVar2 = first;
  do {
    pwVar4 = pwVar2;
    pwVar2 = pwVar4->next;
  } while (pwVar2 != (work_item *)0x0);
  if (pwVar4 == last) {
    pmVar1 = &(thread_pool->queue).mutex;
    mtx_lock(pmVar1);
    pwVar2 = (thread_pool->queue).first_item;
    pwVar4 = (thread_pool->queue).last_item;
    if (pwVar4 == (work_item *)0x0) {
      if (pwVar2 != (work_item *)0x0) {
        __assert_fail("!thread_pool->queue.first_item",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                      ,0xbf,
                      "void submit_work(struct thread_pool *, struct work_item *, struct work_item *)"
                     );
      }
      pwVar3 = &thread_pool->queue;
    }
    else {
      if (pwVar2 == (work_item *)0x0) {
        __assert_fail("thread_pool->queue.first_item",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                      ,0xbb,
                      "void submit_work(struct thread_pool *, struct work_item *, struct work_item *)"
                     );
      }
      pwVar3 = (work_queue *)&pwVar4->next;
    }
    pwVar3->first_item = first;
    (thread_pool->queue).last_item = last;
    if (first == last) {
      cnd_signal(&(thread_pool->queue).avail_cond);
    }
    else {
      cnd_broadcast();
    }
    mtx_unlock(pmVar1);
    return;
  }
  __assert_fail("prev == last",
                "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                ,0xb7,
                "void submit_work(struct thread_pool *, struct work_item *, struct work_item *)");
}

Assistant:

void submit_work(struct thread_pool* thread_pool, struct work_item* first, struct work_item* last) {
#ifndef NDEBUG
    // Ensure that following the links from `first` gives `last` as the last element.
    struct work_item* prev = first;
    while (prev->next) prev = prev->next;
    assert(prev == last);
#endif
    mtx_lock(&thread_pool->queue.mutex);
    if (thread_pool->queue.last_item) {
        assert(thread_pool->queue.first_item);
        thread_pool->queue.last_item->next = first;
        thread_pool->queue.last_item = last;
    } else {
        assert(!thread_pool->queue.first_item);
        thread_pool->queue.first_item = first;
        thread_pool->queue.last_item  = last;
    }
    if (first == last)
        cnd_signal(&thread_pool->queue.avail_cond);
    else
        cnd_broadcast(&thread_pool->queue.avail_cond);
    mtx_unlock(&thread_pool->queue.mutex);
}